

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bignum.cpp
# Opt level: O3

int mbedtls_mpi_read_string(mbedtls_mpi *X,int radix,char *s)

{
  ulong *puVar1;
  char cVar2;
  char cVar3;
  mbedtls_mpi_uint *pmVar4;
  int iVar5;
  size_t sVar6;
  size_t sVar7;
  char *pcVar8;
  byte bVar9;
  size_t sVar10;
  ulong uVar11;
  ulong uVar12;
  ulong uVar13;
  mbedtls_mpi T;
  mbedtls_mpi B;
  mbedtls_mpi local_68;
  char *local_58;
  size_t local_50;
  ulong local_48;
  mbedtls_mpi local_40;
  
  if (radix - 0x11U < 0xfffffff1) {
    return -4;
  }
  local_68.s = 1;
  local_68.n = 0;
  local_68.p = (mbedtls_mpi_uint *)0x0;
  cVar2 = *s;
  if (cVar2 == '\0') {
    mbedtls_mpi_free(X);
    return 0;
  }
  sVar6 = strlen(s + (cVar2 == '-'));
  if (radix == 0x10) {
    if (sVar6 >> 0x3e != 0) {
      return -4;
    }
    iVar5 = mbedtls_mpi_grow(X,((sVar6 >> 4) + 1) - (ulong)((sVar6 & 0xf) == 0));
    if ((iVar5 != 0) || (iVar5 = mbedtls_mpi_grow(X,1), iVar5 != 0)) goto LAB_00348e30;
    memset(X->p,0,(ulong)X->n << 3);
    pmVar4 = X->p;
    *pmVar4 = 0;
    X->s = 1;
    if (sVar6 != 0) {
      pcVar8 = s + (cVar2 == '-');
      bVar9 = 0;
      uVar11 = 0;
      do {
        pcVar8 = pcVar8 + -1;
        cVar3 = pcVar8[sVar6];
        iVar5 = (int)cVar3;
        uVar12 = (ulong)(iVar5 - 0x30);
        if (9 < (byte)(cVar3 - 0x30U)) {
          uVar12 = 0xff;
        }
        uVar13 = (ulong)(iVar5 - 0x37);
        if (5 < (byte)(cVar3 + 0xbfU)) {
          uVar13 = uVar12;
        }
        uVar12 = (ulong)(iVar5 - 0x57);
        if (5 < (byte)(cVar3 + 0x9fU)) {
          uVar12 = uVar13;
        }
        if (0xf < uVar12) goto LAB_00348f74;
        puVar1 = pmVar4 + (uVar11 >> 4);
        *puVar1 = *puVar1 | uVar12 << (bVar9 & 0x3c);
        uVar11 = uVar11 + 1;
        bVar9 = bVar9 + 4;
      } while (sVar6 != uVar11);
    }
  }
  else {
    iVar5 = mbedtls_mpi_grow(X,1);
    if (iVar5 != 0) goto LAB_00348e30;
    memset(X->p,0,(ulong)X->n << 3);
    *X->p = 0;
    X->s = 1;
    if (sVar6 != 0) {
      sVar10 = 0;
      local_58 = s + (cVar2 == '-');
      do {
        cVar3 = local_58[sVar10];
        iVar5 = (int)cVar3;
        uVar11 = (ulong)(iVar5 - 0x30);
        if (9 < (byte)(cVar3 - 0x30U)) {
          uVar11 = 0xff;
        }
        uVar12 = (ulong)(iVar5 - 0x37);
        if (5 < (byte)(cVar3 + 0xbfU)) {
          uVar12 = uVar11;
        }
        uVar11 = (ulong)(iVar5 - 0x57);
        if (5 < (byte)(cVar3 + 0x9fU)) {
          uVar11 = uVar12;
        }
        if ((uint)radix <= uVar11) goto LAB_00348f74;
        local_50 = sVar10;
        iVar5 = mbedtls_mpi_mul_int(&local_68,X,(ulong)(uint)radix);
        if (iVar5 != 0) goto LAB_00348e30;
        local_40.s = 1;
        local_40.n = 1;
        local_40.p = &local_48;
        local_48 = uVar11;
        iVar5 = add_sub_mpi(X,&local_68,&local_40,1);
        if (iVar5 != 0) goto LAB_00348e30;
        sVar10 = local_50 + 1;
      } while (sVar6 != sVar10);
    }
  }
  iVar5 = 0;
  if ((cVar2 == '-') && (sVar7 = mbedtls_mpi_core_bitlen(X->p,(ulong)X->n), sVar7 != 0)) {
    X->s = -1;
  }
LAB_00348e30:
  if (local_68.p != (mbedtls_mpi_uint *)0x0) {
    mbedtls_zeroize_and_free(local_68.p,(ulong)local_68.n << 3);
  }
  return iVar5;
LAB_00348f74:
  iVar5 = -6;
  goto LAB_00348e30;
}

Assistant:

int mbedtls_mpi_read_string(mbedtls_mpi *X, int radix, const char *s)
{
    int ret = MBEDTLS_ERR_ERROR_CORRUPTION_DETECTED;
    size_t i, j, slen, n;
    int sign = 1;
    mbedtls_mpi_uint d;
    mbedtls_mpi T;

    if (radix < 2 || radix > 16) {
        return MBEDTLS_ERR_MPI_BAD_INPUT_DATA;
    }

    mbedtls_mpi_init(&T);

    if (s[0] == 0) {
        mbedtls_mpi_free(X);
        return 0;
    }

    if (s[0] == '-') {
        ++s;
        sign = -1;
    }

    slen = strlen(s);

    if (radix == 16) {
        if (slen > SIZE_MAX >> 2) {
            return MBEDTLS_ERR_MPI_BAD_INPUT_DATA;
        }

        n = BITS_TO_LIMBS(slen << 2);

        MBEDTLS_MPI_CHK(mbedtls_mpi_grow(X, n));
        MBEDTLS_MPI_CHK(mbedtls_mpi_lset(X, 0));

        for (i = slen, j = 0; i > 0; i--, j++) {
            MBEDTLS_MPI_CHK(mpi_get_digit(&d, radix, s[i - 1]));
            X->p[j / (2 * ciL)] |= d << ((j % (2 * ciL)) << 2);
        }
    } else {
        MBEDTLS_MPI_CHK(mbedtls_mpi_lset(X, 0));

        for (i = 0; i < slen; i++) {
            MBEDTLS_MPI_CHK(mpi_get_digit(&d, radix, s[i]));
            MBEDTLS_MPI_CHK(mbedtls_mpi_mul_int(&T, X, radix));
            MBEDTLS_MPI_CHK(mbedtls_mpi_add_int(X, &T, d));
        }
    }

    if (sign < 0 && mbedtls_mpi_bitlen(X) != 0) {
        X->s = -1;
    }

cleanup:

    mbedtls_mpi_free(&T);

    return ret;
}